

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O0

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Opcode opc;
  int extraout_EAX;
  char *args;
  Expr *pEVar1;
  undefined4 in_register_00000034;
  BinaryExpr *this_00;
  BinaryExpr *expr_local;
  ASTPrinter *this_local;
  
  this_00 = (BinaryExpr *)CONCAT44(in_register_00000034,__fd);
  opc = BinaryExpr::op(this_00);
  args = mnemonic(opc);
  printf<char_const*>(this,"BinaryExpr: %s\n",args);
  enter(this);
  printf(this,"lhs:\n");
  enter(this);
  pEVar1 = BinaryExpr::leftExpr(this_00);
  (*(pEVar1->super_ASTNode)._vptr_ASTNode[2])(pEVar1,this);
  leave(this);
  leave(this);
  enter(this);
  printf(this,"rhs:\n");
  enter(this);
  pEVar1 = BinaryExpr::rightExpr(this_00);
  (*(pEVar1->super_ASTNode)._vptr_ASTNode[2])(pEVar1,this);
  leave(this);
  leave(this);
  return extraout_EAX;
}

Assistant:

void ASTPrinter::accept(BinaryExpr& expr) {
  printf("BinaryExpr: %s\n", mnemonic(expr.op()));
  enter();
  printf("lhs:\n");
  enter();
  expr.leftExpr()->visit(*this);
  leave();
  leave();
  enter();
  printf("rhs:\n");
  enter();
  expr.rightExpr()->visit(*this);
  leave();
  leave();
}